

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_sse4.c
# Opt level: O2

void lowbd_fwd_txfm2d_64x64_sse4_1(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int8_t *piVar1;
  int bit;
  __m128i *out;
  int i_1;
  long lVar2;
  __m128i *palVar3;
  int i;
  long lVar4;
  int out_size;
  undefined1 auVar5 [16];
  undefined1 in_XMM1 [16];
  __m128i bufB [64];
  __m128i bufA [64];
  __m128i buf0 [64];
  __m128i buf1 [512];
  
  piVar1 = av1_fwd_txfm_shift_ls[4];
  palVar3 = buf1;
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    load_buffer_16bit_to_16bit(input + lVar4 * 8,stride,buf0,0x40);
    round_shift_16bit(buf0,0x40,(int)*piVar1);
    av1_fdct8x64_new_sse2(buf0,buf0,'\r');
    round_shift_16bit(buf0,0x40,(int)piVar1[1]);
    out = palVar3;
    for (lVar2 = 0; lVar2 != 0x200; lVar2 = lVar2 + 0x80) {
      transpose_16bit_8x8((__m128i *)((long)buf0[0] + lVar2),out);
      out = out + 0x40;
    }
    palVar3 = palVar3 + 8;
  }
  palVar3 = buf1;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    for (lVar2 = 0; lVar2 != 0x400; lVar2 = lVar2 + 0x10) {
      auVar5 = *(undefined1 (*) [16])((long)*palVar3 + lVar2);
      in_XMM1 = pmovsxwd(in_XMM1,auVar5);
      *(undefined1 (*) [16])((long)bufA[0] + lVar2) = in_XMM1;
      auVar5._0_8_ = auVar5._8_8_;
      auVar5 = pmovsxwd(auVar5,auVar5);
      *(undefined1 (*) [16])((long)bufB[0] + lVar2) = auVar5;
    }
    out_size = 1;
    av1_fdct64_sse4_1(bufA,bufA,'\n',1,1);
    av1_fdct64_sse4_1(bufB,bufB,'\n',1,1);
    bit = -(int)piVar1[2];
    av1_round_shift_array_32_sse4_1(bufA,bufA,0x20,bit);
    av1_round_shift_array_32_sse4_1(bufB,bufB,0x20,bit);
    store_output_32bit_w8(output + lVar4 * 8,bufA,bufB,bit,out_size);
    palVar3 = palVar3 + 0x40;
  }
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_64x64_sse4_1(const int16_t *input, int32_t *output,
                                          int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  (void)tx_type;
  assert(tx_type == DCT_DCT);
  const TX_SIZE tx_size = TX_64X64;
  __m128i buf0[64], buf1[512];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_sse2 col_txfm = av1_fdct8x64_new_sse2;
  const int width_div8 = (width >> 3);
  const int height_div8 = (height >> 3);

  for (int i = 0; i < width_div8; i++) {
    load_buffer_16bit_to_16bit(input + 8 * i, stride, buf0, height);
    round_shift_16bit(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit(buf0, height, shift[1]);
    for (int j = 0; j < AOMMIN(4, height_div8); ++j) {
      transpose_16bit_8x8(buf0 + j * 8, buf1 + j * width + 8 * i);
    }
  }
  for (int i = 0; i < AOMMIN(4, height_div8); i++) {
    __m128i bufA[64];
    __m128i bufB[64];
    __m128i *buf = buf1 + width * i;
    for (int j = 0; j < width; ++j) {
      bufA[j] = _mm_cvtepi16_epi32(buf[j]);
      bufB[j] = _mm_cvtepi16_epi32(_mm_unpackhi_epi64(buf[j], buf[j]));
    }
    av1_fdct64_sse4_1(bufA, bufA, cos_bit_row, 1, 1);
    av1_fdct64_sse4_1(bufB, bufB, cos_bit_row, 1, 1);
    av1_round_shift_array_32_sse4_1(bufA, bufA, 32, -shift[2]);
    av1_round_shift_array_32_sse4_1(bufB, bufB, 32, -shift[2]);

    store_output_32bit_w8(output + i * 8, bufA, bufB, 32, 32);
  }
}